

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Svd.h
# Opt level: O0

USV * singular::Svd<60,_50>::decomposeUSV(USV *__return_storage_ptr__,Matrix<60,_50> *m)

{
  bool bVar1;
  bool bVar2;
  int in_ECX;
  void *__child_stack;
  BidiagonalMatrix *this;
  void *in_R8;
  double dVar3;
  double extraout_XMM0_Qa;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  DiagonalMatrix<60,_50> local_578;
  undefined4 local_56c;
  Matrix<50,_50> local_568;
  DiagonalMatrix<60,_50> local_560;
  Matrix<60,_60> local_558;
  double (*local_550) [50];
  double local_548;
  double ss2 [60];
  int local_360;
  int i_1;
  bool sortNeeded;
  int shuffle [60];
  undefined1 local_218 [8];
  Vector<double> vi;
  int i;
  double ss [50];
  double bn;
  int n;
  int iteration;
  BidiagonalMatrix local_48;
  BidiagonalMatrix m2;
  Matrix<50,_50> local_30;
  Matrix<50,_50> v;
  Matrix<60,_60> u;
  int MAX_ITERATIONS;
  Matrix<60,_50> *m_local;
  
  Matrix<60,_60>::identity();
  Matrix<50,_50>::identity();
  Matrix<60,_50>::clone((Matrix<60,_50> *)&n,(__fn *)m,__child_stack,in_ECX,in_R8);
  bidiagonalize((Svd<60,_50> *)&local_48,(Matrix<60,_60> *)&v,(Matrix<60,_50> *)&n,&local_30);
  Matrix<60,_50>::~Matrix((Matrix<60,_50> *)&n);
  bn._4_4_ = 0;
  bn._0_4_ = 0x32;
  while (1 < bn._0_4_) {
    dVar3 = BidiagonalMatrix::operator()(&local_48,bn._0_4_ + -1,bn._0_4_ + -1);
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      this = &local_48;
      BidiagonalMatrix::operator()(this,bn._0_4_ + -2,bn._0_4_ + -1);
      std::abs((int)this);
      if (extraout_XMM0_Qa < 1e-15) goto LAB_0010e352;
      bn._4_4_ = bn._4_4_ + 1;
      if (500 < bn._4_4_) break;
      doFrancis((Matrix<60,_60> *)&v,&local_48,&local_30,bn._0_4_);
    }
    else {
LAB_0010e352:
      bn._0_4_ = bn._0_4_ + -1;
    }
  }
  for (vi.delta._4_4_ = 0; vi.delta._4_4_ < 0x32; vi.delta._4_4_ = vi.delta._4_4_ + 1) {
    dVar3 = BidiagonalMatrix::operator()(&local_48,vi.delta._4_4_,vi.delta._4_4_);
    if (0.0 <= dVar3) {
      dVar3 = BidiagonalMatrix::operator()(&local_48,vi.delta._4_4_,vi.delta._4_4_);
      ss[(long)vi.delta._4_4_ + -1] = dVar3;
    }
    else {
      dVar3 = BidiagonalMatrix::operator()(&local_48,vi.delta._4_4_,vi.delta._4_4_);
      ss[(long)vi.delta._4_4_ + -1] = -dVar3;
      Matrix<50,_50>::column((Vector<double> *)local_218,&local_30,vi.delta._4_4_);
      iVar4 = Vector<double>::begin((Vector<double> *)local_218);
      iVar5 = Vector<double>::end((Vector<double> *)local_218);
      iVar6 = Vector<double>::begin((Vector<double> *)local_218);
      std::
      transform<singular::Vector<double>::general_iterator<double>,singular::Vector<double>::general_iterator<double>,singular::Svd<60,50>::decomposeUSV(singular::Matrix<60,50>const&)::_lambda(double)_1_>
                (iVar4.ptr,iVar4.delta,iVar5.ptr,iVar5.delta,iVar6.ptr,iVar6.delta);
    }
  }
  bVar1 = false;
  for (local_360 = 0; local_360 < 0x3c; local_360 = local_360 + 1) {
    (&i_1)[local_360] = local_360;
    bVar2 = !bVar1;
    bVar1 = true;
    if ((bVar2) && (bVar1 = false, local_360 < 0x31)) {
      bVar1 = ss[(long)local_360 + -1] < ss[(long)(local_360 + 1) + -1];
    }
  }
  if (bVar1) {
    ss2[0x3b] = (double)&stack0xfffffffffffffe08;
    std::
    sort<int*,singular::Svd<60,50>::decomposeUSV(singular::Matrix<60,50>const&)::_lambda(int,int)_1_>
              (&i_1,shuffle + 0x30,(anon_class_8_1_3fcf671e)ss2[0x3b]);
    local_550 = (double (*) [50])&stack0xfffffffffffffe08;
    std::
    transform<int*,double*,singular::Svd<60,50>::decomposeUSV(singular::Matrix<60,50>const&)::_lambda(int)_1_>
              (&i_1,shuffle + 0x30,&local_548,(anon_class_8_1_3fcf671e)local_550);
    Matrix<60,_60>::shuffleColumns(&local_558,(int *)&v);
    DiagonalMatrix<60,_50>::DiagonalMatrix(&local_560,&local_548);
    Matrix<50,_50>::shuffleColumns(&local_568,(int *)&local_30);
    std::make_tuple<singular::Matrix<60,60>,singular::DiagonalMatrix<60,50>,singular::Matrix<50,50>>
              (__return_storage_ptr__,&local_558,&local_560,&local_568);
    Matrix<50,_50>::~Matrix(&local_568);
    DiagonalMatrix<60,_50>::~DiagonalMatrix(&local_560);
    Matrix<60,_60>::~Matrix(&local_558);
  }
  else {
    DiagonalMatrix<60,_50>::DiagonalMatrix(&local_578,(double *)&stack0xfffffffffffffe08);
    std::make_tuple<singular::Matrix<60,60>,singular::DiagonalMatrix<60,50>,singular::Matrix<50,50>>
              (__return_storage_ptr__,(Matrix<60,_60> *)&v,&local_578,&local_30);
    DiagonalMatrix<60,_50>::~DiagonalMatrix(&local_578);
  }
  local_56c = 1;
  BidiagonalMatrix::~BidiagonalMatrix(&local_48);
  Matrix<50,_50>::~Matrix(&local_30);
  Matrix<60,_60>::~Matrix((Matrix<60,_60> *)&v);
  return __return_storage_ptr__;
}

Assistant:

static USV decomposeUSV(const Matrix< M, N >& m) {
			// makes sure that M >= N
			// otherwise decomposes the transposed matrix
			if (M < N) {
				// A^T = V * S^T * U^T
				typename Svd< N, M >::USV usvT =
					Svd< N, M >::decomposeUSV(m.transpose());
				return std::make_tuple(
					std::move(std::get< 2 >(usvT)),
					std::get< 1 >(usvT).transpose(),
					std::move(std::get< 0 >(usvT)));
			}
			const int MAX_ITERATIONS = N * 10;
			// allocates matrices
			Matrix< M, M > u = Matrix< M, M >::identity();
			// Matrix< M, N > s = m.clone();
			Matrix< N, N > v = Matrix< N, N >::identity();
			// bidiagonalizes a given matrix
			BidiagonalMatrix m2 = bidiagonalize(u, m.clone(), v);
			// repeats Francis iteration
			int iteration = 0;
			int n = N;
			while (n >= 2) {
				// processes the n-1 x n-1 submatrix
				// if the current n x n submatrix has converged
				double bn = m2(n - 1, n - 1);
				if (bn == 0.0 || std::abs(m2(n - 2, n - 1) / bn) < 1.0e-15) {
					--n;
				} else {
					// aborts if too many iterations
					++iteration;
					if (iteration > MAX_ITERATIONS) {
						break;
					}
					doFrancis(u, m2, v, n);
				}
			}
			// copies the diagonal elements
			// and makes all singular values positive
			double ss[N];
			for (int i = 0; i < N; ++i) {
				if (m2(i, i) < 0) {
					ss[i] = -m2(i, i);
					// inverts the sign of the right singular vector
					Vector< double > vi = v.column(i);
					std::transform(
						vi.begin(), vi.end(), vi.begin(),
						[](double x) {
							return -x;
						});
				} else {
					ss[i] = m2(i, i);
				}
			}
			// sorts singular values in descending order if necessary
			int shuffle[M];  // M >= N
			bool sortNeeded = false;
			for (int i = 0; i < M; ++i) {
				shuffle[i] = i;
				sortNeeded = sortNeeded || (i < N - 1 && ss[i] < ss[i + 1]);
			}
			if (sortNeeded) {
				// shuffles the N (<= M) singular values
				std::sort(shuffle, shuffle + N, [&ss](int i, int j) {
					return ss[i] > ss[j];  // descending order
				});
				double ss2[M];
				std::transform(shuffle, shuffle + N, ss2, [&ss](int i) {
					return ss[i];
				});
				return std::make_tuple(u.shuffleColumns(shuffle),
									   DiagonalMatrix< M, N >(ss2),
									   v.shuffleColumns(shuffle));
			} else {
				return std::make_tuple(std::move(u),
									   DiagonalMatrix< M, N >(ss),
									   std::move(v));
			}
		}